

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_MPI ref_mpi;
  long lVar2;
  bool bVar3;
  REF_INT *part;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  REF_INT *send_size;
  ulong uVar7;
  REF_INT *pRVar8;
  void *pvVar9;
  REF_GLOB *pRVar10;
  undefined4 *puVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  REF_INT nunique;
  void *local_1c8;
  undefined4 *local_1c0;
  ulong local_1b8;
  void *local_1b0;
  REF_GLOB *local_1a8;
  REF_INT *local_1a0;
  int local_198;
  int local_194;
  REF_INT *local_190;
  REF_INT nodes [27];
  REF_INT unique_parts [27];
  REF_INT all_parts [27];
  
  ref_mpi = ref_node->ref_mpi;
  uVar14 = (ulong)ref_mpi->n;
  if ((long)uVar14 < 2) {
    return 0;
  }
  send_size = (REF_INT *)malloc(uVar14 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar17 = "malloc a_size of REF_INT NULL";
    uVar13 = 0x5dd;
  }
  else {
    for (uVar7 = 0; uVar7 < uVar14; uVar7 = uVar7 + 1) {
      send_size[uVar7] = 0;
    }
    pRVar8 = (REF_INT *)malloc(uVar14 * 4);
    if (pRVar8 == (REF_INT *)0x0) {
      pcVar17 = "malloc b_size of REF_INT NULL";
      uVar13 = 0x5de;
    }
    else {
      for (uVar7 = 0; uVar7 < uVar14; uVar7 = uVar7 + 1) {
        pRVar8[uVar7] = 0;
      }
      local_1a0 = pRVar8;
      for (iVar19 = 0; iVar19 < ref_cell->max; iVar19 = iVar19 + 1) {
        RVar4 = ref_cell_nodes(ref_cell,iVar19,nodes);
        if (RVar4 == 0) {
          uVar5 = ref_cell->node_per;
          uVar14 = 0;
          if (0 < (int)uVar5) {
            uVar14 = (ulong)uVar5;
          }
          for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
            all_parts[uVar7] = ref_node->part[nodes[uVar7]];
          }
          uVar5 = ref_sort_unique_int(uVar5,all_parts,&nunique,unique_parts);
          if (uVar5 != 0) {
            pcVar17 = "unique";
            uVar13 = 0x5e6;
            goto LAB_00211b6d;
          }
          uVar14 = (ulong)(uint)nunique;
          if (nunique < 1) {
            uVar14 = 0;
          }
          for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
            if (ref_mpi->id != unique_parts[uVar7]) {
              send_size[unique_parts[uVar7]] = send_size[unique_parts[uVar7]] + 1;
            }
          }
        }
      }
      uVar5 = ref_mpi_alltoall(ref_mpi,send_size,local_1a0,1);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x5ee,"ref_migrate_shufflin_cell",(ulong)uVar5,"alltoall sizes");
        return uVar5;
      }
      uVar5 = ref_mpi->n;
      uVar14 = 0;
      uVar7 = 0;
      if (0 < (int)uVar5) {
        uVar7 = (ulong)uVar5;
      }
      iVar19 = 0;
      for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        iVar19 = iVar19 + send_size[uVar14];
      }
      iVar1 = ref_cell->size_per;
      uVar6 = iVar19 * iVar1;
      if ((int)uVar6 < 0) {
        pcVar17 = "malloc a_c2n of REF_GLOB negative";
        uVar13 = 0x5f2;
LAB_00211ba1:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               uVar13,"ref_migrate_shufflin_cell",pcVar17);
        return 1;
      }
      local_1c0 = (undefined4 *)(ulong)uVar6;
      local_1b8 = (ulong)uVar5;
      pvVar9 = malloc((long)local_1c0 * 8);
      if (pvVar9 == (void *)0x0) {
        pcVar17 = "malloc a_c2n of REF_GLOB NULL";
        uVar13 = 0x5f2;
      }
      else {
        local_1c8 = pvVar9;
        local_1b0 = malloc((long)local_1c0 << 2);
        if (local_1b0 == (void *)0x0) {
          pcVar17 = "malloc a_parts of REF_INT NULL";
          uVar13 = 0x5f3;
        }
        else {
          iVar19 = 0;
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            iVar19 = iVar19 + local_1a0[uVar14];
          }
          uVar5 = iVar1 * iVar19;
          if ((int)uVar5 < 0) {
            pcVar17 = "malloc b_c2n of REF_GLOB negative";
            uVar13 = 0x5f7;
            goto LAB_00211ba1;
          }
          local_198 = iVar19;
          pRVar10 = (REF_GLOB *)malloc((ulong)uVar5 * 8);
          if (pRVar10 == (REF_GLOB *)0x0) {
            pcVar17 = "malloc b_c2n of REF_GLOB NULL";
            uVar13 = 0x5f7;
          }
          else {
            local_1a8 = pRVar10;
            pRVar8 = (REF_INT *)malloc((ulong)uVar5 << 2);
            if (pRVar8 == (REF_INT *)0x0) {
              pcVar17 = "malloc b_parts of REF_INT NULL";
              uVar13 = 0x5f8;
            }
            else {
              if ((int)local_1b8 < 0) {
                pcVar17 = "malloc a_next of REF_INT negative";
                uVar13 = 0x5fa;
                goto LAB_00211ba1;
              }
              puVar11 = (undefined4 *)malloc(local_1b8 * 4);
              if (puVar11 != (undefined4 *)0x0) {
                *puVar11 = 0;
                iVar19 = 0;
                for (uVar14 = 1; uVar14 < local_1b8; uVar14 = uVar14 + 1) {
                  iVar19 = iVar19 + send_size[uVar14 - 1];
                  puVar11[uVar14] = iVar19;
                }
                lVar2 = -1;
                iVar19 = 0;
                local_1c0 = puVar11;
                local_190 = pRVar8;
                while (pRVar8 = local_1a0, iVar19 < ref_cell->max) {
                  local_194 = iVar19;
                  RVar4 = ref_cell_nodes(ref_cell,iVar19,nodes);
                  if (RVar4 == 0) {
                    uVar5 = ref_cell->node_per;
                    uVar14 = 0;
                    if (0 < (int)uVar5) {
                      uVar14 = (ulong)uVar5;
                    }
                    for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
                      all_parts[uVar7] = ref_node->part[nodes[uVar7]];
                    }
                    uVar5 = ref_sort_unique_int(uVar5,all_parts,&nunique,unique_parts);
                    if (uVar5 != 0) {
                      pcVar17 = "unique";
                      uVar13 = 0x605;
                      goto LAB_00211b6d;
                    }
                    uVar5 = nunique;
                    if (nunique < 1) {
                      uVar5 = 0;
                    }
                    local_1b8 = (ulong)uVar5;
                    for (uVar14 = 0; uVar14 != local_1b8; uVar14 = uVar14 + 1) {
                      iVar19 = unique_parts[uVar14];
                      if (ref_mpi->id != iVar19) {
                        uVar5 = ref_cell->node_per;
                        uVar7 = 0;
                        if (0 < (int)uVar5) {
                          uVar7 = (ulong)uVar5;
                        }
                        for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
                          lVar18 = (long)nodes[uVar16];
                          lVar12 = lVar2;
                          if (((-1 < lVar18) && (nodes[uVar16] < ref_node->max)) &&
                             (lVar12 = ref_node->global[lVar18], ref_node->global[lVar18] < 0)) {
                            lVar12 = lVar2;
                          }
                          lVar15 = (long)(int)local_1c0[iVar19] * (long)ref_cell->size_per + uVar16;
                          *(long *)((long)local_1c8 + lVar15 * 8) = lVar12;
                          *(REF_INT *)((long)local_1b0 + lVar15 * 4) = ref_node->part[lVar18];
                        }
                        iVar1 = local_1c0[iVar19];
                        if (ref_cell->last_node_is_an_id != 0) {
                          lVar12 = (long)(int)(ref_cell->size_per * iVar1 + uVar5);
                          *(long *)((long)local_1c8 + lVar12 * 8) = (long)nodes[(int)uVar5];
                          *(undefined4 *)((long)local_1b0 + lVar12 * 4) = 0xffffffff;
                        }
                        local_1c0[iVar19] = iVar1 + 1;
                      }
                    }
                  }
                  iVar19 = local_194 + 1;
                }
                uVar5 = ref_mpi_alltoallv(ref_mpi,local_1c8,send_size,local_1a8,local_1a0,
                                          ref_cell->size_per,2);
                part = local_190;
                if (uVar5 == 0) {
                  uVar5 = ref_mpi_alltoallv(ref_mpi,local_1b0,send_size,local_190,pRVar8,
                                            ref_cell->size_per,1);
                  if (uVar5 == 0) {
                    uVar5 = ref_cell_add_many_global
                                      (ref_cell,ref_node,local_198,local_1a8,part,ref_mpi->id);
                    if (uVar5 == 0) {
                      free(local_1c0);
                      free(part);
                      free(local_1a8);
                      free(local_1b0);
                      free(local_1c8);
                      free(pRVar8);
                      free(send_size);
                      iVar19 = 0;
                      do {
                        if (ref_cell->max <= iVar19) {
                          return 0;
                        }
                        RVar4 = ref_cell_nodes(ref_cell,iVar19,nodes);
                        if (RVar4 == 0) {
                          uVar7 = 0;
                          uVar14 = (ulong)(uint)ref_cell->node_per;
                          if (ref_cell->node_per < 1) {
                            uVar14 = uVar7;
                          }
                          bVar20 = false;
                          for (; uVar14 != uVar7; uVar7 = uVar7 + 1) {
                            bVar3 = !bVar20;
                            bVar20 = true;
                            if (bVar3) {
                              bVar20 = ref_mpi->id == ref_node->part[nodes[uVar7]];
                            }
                          }
                          if ((!bVar20) && (uVar5 = ref_cell_remove(ref_cell,iVar19), uVar5 != 0)) {
                            pcVar17 = "remove";
                            uVar13 = 0x634;
                            goto LAB_00211b6d;
                          }
                        }
                        iVar19 = iVar19 + 1;
                      } while( true );
                    }
                    pcVar17 = "g";
                    uVar13 = 0x624;
                  }
                  else {
                    pcVar17 = "alltoallv parts";
                    uVar13 = 0x620;
                  }
                }
                else {
                  pcVar17 = "alltoallv c2n";
                  uVar13 = 0x61d;
                }
LAB_00211b6d:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,uVar13,"ref_migrate_shufflin_cell",(ulong)uVar5,pcVar17);
                return uVar5;
              }
              pcVar17 = "malloc a_next of REF_INT NULL";
              uVar13 = 0x5fa;
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar13,
         "ref_migrate_shufflin_cell",pcVar17);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,
                                             REF_CELL ref_cell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT all_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT nunique;
  REF_INT unique_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT part, node, cell, i;
  REF_INT *a_next;
  REF_GLOB *a_c2n, *b_c2n;
  REF_INT *a_parts, *b_parts;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) a_size[part]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_c2n, ref_cell_size_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_parts, ref_cell_size_per(ref_cell) * a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_c2n, ref_cell_size_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_parts, ref_cell_size_per(ref_cell) * b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) {
        for (i = 0; i < ref_cell_node_per(ref_cell); i++) {
          a_c2n[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_global(ref_node, nodes[i]);
          a_parts[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_part(ref_node, nodes[i]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          a_c2n[ref_cell_node_per(ref_cell) +
                ref_cell_size_per(ref_cell) * a_next[part]] =
              (REF_GLOB)nodes[ref_cell_node_per(ref_cell)];
          a_parts[ref_cell_node_per(ref_cell) +
                  ref_cell_size_per(ref_cell) * a_next[part]] = REF_EMPTY;
        }
        a_next[part]++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_c2n, a_size, b_c2n, b_size,
                        ref_cell_size_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv c2n");
  RSS(ref_mpi_alltoallv(ref_mpi, a_parts, a_size, b_parts, b_size,
                        ref_cell_size_per(ref_cell), REF_INT_TYPE),
      "alltoallv parts");

  RSS(ref_cell_add_many_global(ref_cell, ref_node, b_total, b_c2n, b_parts,
                               ref_mpi_rank(ref_mpi)),
      "g");

  free(a_next);
  free(b_parts);
  free(b_c2n);
  free(a_parts);
  free(a_c2n);
  free(b_size);
  free(a_size);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    need_to_keep = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      need_to_keep = (need_to_keep || (ref_mpi_rank(ref_mpi) ==
                                       ref_node_part(ref_node, nodes[node])));
    }
    if (!need_to_keep) RSS(ref_cell_remove(ref_cell, cell), "remove");
  }

  return REF_SUCCESS;
}